

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diner-demo.c
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  dining_policy_t dVar3;
  uint uVar4;
  int local_1f0;
  int local_1ec;
  int i_6;
  int i_5;
  int i_4;
  int i_3;
  int go_on;
  int i_2;
  int id2;
  int id1;
  int i_1;
  int i;
  int status;
  sched_param sched_parameters;
  pthread_t this_thread;
  diner_t diner [5];
  fork_t fork [5];
  Configuration config;
  char **argv_local;
  int argc_local;
  
  fork[4].lock.__data.__list.__next = (__pthread_internal_list *)0x200000005;
  parseCommandLine(argc,argv,(Configuration *)&fork[4].lock.__data.__list.__next);
  printf("Number of Philosophers: %d\n",fork[4].lock.__data.__list.__next & 0xffffffff);
  printf("Think Time: %d seconds\n",(ulong)fork[4].lock._32_8_ >> 0x20);
  printf("Eat Time: %d seconds\n",3);
  printf("Enumerate Resources: %s\n");
  _status = pthread_self();
  i = sched_get_priority_max(0);
  iVar2 = pthread_setschedparam(_status,0,(sched_param *)&i);
  if (iVar2 == 0) {
    for (id1 = 0; id1 < 5; id1 = id1 + 1) {
      fork_init((fork_t *)&fork[(long)id1 + -1].lock.__data.__list.__next,id1);
    }
    for (id2 = 0; id2 < 5; id2 = id2 + 1) {
      uVar4 = (id2 + 1) % 5;
      dVar3 = get_dining_policy();
      if ((dVar3 == FORK_REORDERING) && ((int)uVar4 < id2)) {
        printf("Reordered forks %d and %d\n",(ulong)(uint)id2,(ulong)uVar4);
        diner_init((diner_t *)&diner[(long)id2 + -1].thread,id2,
                   (fork_t *)&fork[(long)(int)uVar4 + -1].lock.__data.__list.__next,
                   (fork_t *)&fork[(long)id2 + -1].lock.__data.__list.__next);
      }
      else {
        diner_init((diner_t *)&diner[(long)id2 + -1].thread,id2,
                   (fork_t *)&fork[(long)id2 + -1].lock.__data.__list.__next,
                   (fork_t *)&fork[(long)(int)uVar4 + -1].lock.__data.__list.__next);
      }
    }
    for (i_3 = 0; i_3 < 5; i_3 = i_3 + 1) {
      printf("Creating thread %d",(ulong)(uint)i_3);
      diner_start((diner_t *)&diner[(long)i_3 + -1].thread);
    }
    bVar1 = true;
    while (bVar1) {
      for (i_5 = 0; i_5 < 5; i_5 = i_5 + 1) {
        putchar((int)*(char *)((long)&diner[(long)i_5 + -1].thread + 1));
      }
      putchar(10);
      bVar1 = false;
      for (i_6 = 0; i_6 < 5; i_6 = i_6 + 1) {
        bVar1 = (bool)(*(char *)((long)&diner[(long)i_6 + -1].thread + 1) != 'd' | bVar1);
      }
      millisecond_sleep(0x33);
    }
    for (local_1ec = 0; local_1ec < 5; local_1ec = local_1ec + 1) {
      diner_await((diner_t *)&diner[(long)local_1ec + -1].thread);
      printf("Diner id %c exited normally; state = %c\n",
             (ulong)(uint)(int)(char)diner[(long)local_1ec + -1].thread,
             (ulong)(uint)(int)*(char *)((long)&diner[(long)local_1ec + -1].thread + 1));
    }
    for (local_1f0 = 0; local_1f0 < 5; local_1f0 = local_1f0 + 1) {
      fork_free_resources((fork_t *)&fork[(long)local_1f0 + -1].lock.__data.__list.__next);
    }
    return 0;
  }
  fprintf(_stderr,"Cannot set main thread max prioirty. Fatal.\n");
  exit(1);
}

Assistant:

int main(int argc, char **argv) {
    Configuration config = {
        .num_philosophers = 5,      // default number of philosophers
        .think_time = 2,            // default think time in seconds
        .eat_time = 3,              // default eat time in seconds
        .enumerate_resources = 0    // default for resource enumeration: off
    };

    parseCommandLine(argc, argv, &config);

    printf("Number of Philosophers: %d\n", config.num_philosophers);
    printf("Think Time: %d seconds\n", config.think_time);
    printf("Eat Time: %d seconds\n", config.eat_time);
    printf("Enumerate Resources: %s\n", config.enumerate_resources ? "Yes" : "No");

    fork_t fork[MAX_DINERS];
    diner_t diner[MAX_DINERS];

    /* The main thread  */
    pthread_t this_thread = pthread_self();
    struct sched_param sched_parameters;
    sched_parameters.sched_priority = sched_get_priority_max(SCHED_OTHER);
    int status = pthread_setschedparam(this_thread, SCHED_OTHER, &sched_parameters);

    // the main thread monitors the state of the diners and runs at highest
    // priority so it can continue doing something, even if (or when) the other
    // threads get deadlocked.

    if (status != 0)
    {
        fprintf(stderr, "Cannot set main thread max prioirty. Fatal.\n");
        exit(1);
    }

    /* initialize the shared resources (forks) */
    for (int i = 0; i < MAX_DINERS; i++)
        fork_init(&fork[i], i);

    /* initialize the diners to link to the shared resources (forks) */
    for (int i = 0; i < MAX_DINERS; i++)
    {
        int id1 = i;
        int id2 = (i + 1) % MAX_DINERS;
        if (get_dining_policy() == FORK_REORDERING && id1 > id2)
        {
            printf("Reordered forks %d and %d\n", id1, id2);
            diner_init(&diner[i], i, &fork[id2], &fork[id1]);
        }
        else
        {
            diner_init(&diner[i], i, &fork[id1], &fork[id2]);
        }
    }

    /* start the actual threads for each diner */
    for (int i = 0; i < MAX_DINERS; i++)
    {
        printf("Creating thread %d", i);
        diner_start(&diner[i]);
    }

    /* monitor the state of the diners in the main (highest-priority) thread
     * because it is high priority, it must sleep for a short time to give
     * the diner threads a chance to do their thing.
     */
    int go_on = 1;
    while (go_on)
    {
        for (int i = 0; i < MAX_DINERS; i++)
        {
            putchar(diner[i].state);
        }
        putchar('\n');
        go_on = 0;
        for (int i = 0; i < MAX_DINERS; i++)
        {
            go_on |= diner[i].state != 'd';
        }
        millisecond_sleep(MAIN_THREAD_SLEEP_TIME);
    }

    /* assuming no deadlock happened, this code will be reached so we
     * can join with the main thread
     */

    for (int i=0; i < MAX_DINERS; i++)
    {
        diner_await(&diner[i]);
        printf("Diner id %c exited normally; state = %c\n", diner[i].id, diner[i].state);
    }

    /* locks associated with forks need to be cleaned up */
    for (int i = 0; i < MAX_DINERS; i++)
        fork_free_resources(&fork[i]);

    /* attribute object should also be freed (could do earlier, too) */
    //pthread_attr_destroy(&attr);
}